

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::save_load_memory_tree(memory_tree *b,io_buf *model_file,bool read,bool text)

{
  v_array<memory_tree_ns::node> *this;
  int *oas;
  vw *pvVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint32_t *puVar5;
  ulong uVar6;
  size_t n_nodes;
  size_t n_examples;
  example *new_ec;
  stringstream msg;
  bool local_22a;
  bool local_229;
  memory_tree *local_228;
  io_buf *local_220;
  ulong local_218;
  undefined4 local_210;
  undefined4 local_20c;
  node local_208;
  example *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_22a = text;
  local_229 = read;
  local_228 = b;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_220 = model_file;
  if ((model_file->files)._end == (model_file->files)._begin) goto LAB_001eeed2;
  if (read) {
    local_228->test_mode = true;
    local_208.parent = 0;
    local_208.internal = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"stride_shift",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    io_buf::bin_read_fixed(local_220,(char *)&local_208,8,"");
    pvVar1 = local_228->all;
    if ((pvVar1->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar1->weights).sparse_weights,local_208.parent);
    }
    else {
      (pvVar1->weights).dense_weights._stride_shift = local_208.parent;
    }
  }
  else {
    pvVar1 = local_228->all;
    puVar5 = &(pvVar1->weights).dense_weights._stride_shift;
    if ((pvVar1->weights).sparse != false) {
      puVar5 = &(pvVar1->weights).sparse_weights._stride_shift;
    }
    local_208._0_8_ = ZEXT48(*puVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"stride_shift",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    bin_text_write_fixed(local_220,(char *)&local_208,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"max_nodes",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (read) {
    io_buf::bin_read_fixed(local_220,(char *)&local_228->max_nodes,8,"");
  }
  else {
    bin_text_write_fixed(local_220,(char *)&local_228->max_nodes,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"learn_at_leaf",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_228->learn_at_leaf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (read) {
    io_buf::bin_read_fixed(local_220,(char *)&local_228->learn_at_leaf,4,"");
  }
  else {
    bin_text_write_fixed
              (local_220,(char *)&local_228->learn_at_leaf,4,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"oas",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_228->oas);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  oas = &local_228->oas;
  if (read) {
    io_buf::bin_read_fixed(local_220,(char *)oas,4,"");
  }
  else {
    bin_text_write_fixed(local_220,(char *)oas,4,(stringstream *)local_1b8,text);
  }
  local_218 = ((long)(local_228->nodes)._end - (long)(local_228->nodes)._begin >> 3) *
              -0x71c71c71c71c71c7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"nodes",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (read) {
    io_buf::bin_read_fixed(local_220,(char *)&local_218,8,"");
  }
  else {
    bin_text_write_fixed(local_220,(char *)&local_218,8,(stringstream *)local_1b8,text);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"max_number_of_labels",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  this = &local_228->nodes;
  local_20c = (undefined4)CONCAT71(in_register_00000009,text);
  local_210 = (undefined4)CONCAT71(in_register_00000011,read);
  if (read) {
    io_buf::bin_read_fixed(local_220,(char *)&local_228->max_num_labels,8,"");
    v_array<memory_tree_ns::node>::clear(this);
    if (local_218 != 0) {
      uVar4 = 1;
      do {
        local_208.parent = 0;
        local_208.internal = 0;
        local_208.depth = 0;
        local_208.base_router = 0;
        local_208.left = 0;
        local_208.right = 0;
        local_208.nl = 0.001;
        local_208.nr = 0.001;
        local_208.examples_index.end_array = (uint *)0x0;
        local_208.examples_index.erase_count = 0;
        local_208.examples_index._begin = (uint *)0x0;
        local_208.examples_index._end = (uint *)0x0;
        v_array<memory_tree_ns::node>::push_back(this,&local_208);
        bVar2 = uVar4 < local_218;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar2);
      goto LAB_001eed3d;
    }
  }
  else {
    bin_text_write_fixed
              (local_220,(char *)&local_228->max_num_labels,8,(stringstream *)local_1b8,text);
LAB_001eed3d:
    if (local_218 != 0) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        save_load_node(this->_begin + uVar4,local_220,&local_229,&local_22a,
                       (stringstream *)local_1b8);
        bVar2 = uVar6 < local_218;
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
  }
  local_208._0_8_ = (long)(local_228->examples)._end - (long)(local_228->examples)._begin >> 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"examples",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  local_228 = (memory_tree *)&local_228->examples;
  if ((char)local_210 == '\0') {
    bin_text_write_fixed
              (local_220,(char *)&local_208,8,(stringstream *)local_1b8,SUB41(local_20c,0));
  }
  else {
    io_buf::bin_read_fixed(local_220,(char *)&local_208,8,"");
    v_array<example_*>::clear((v_array<example_*> *)local_228);
    if (local_208._0_8_ == 0) goto LAB_001eeed2;
    uVar4 = 1;
    do {
      local_1c0 = calloc_or_throw<example>(1);
      v_array<example_*>::push_back((v_array<example_*> *)local_228,&local_1c0);
      bVar2 = uVar4 < (ulong)local_208._0_8_;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  if (local_208._0_8_ != 0) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      save_load_example((example *)(&local_228->all->sd)[uVar4],local_220,&local_229,&local_22a,
                        (stringstream *)local_1b8,oas);
      bVar2 = uVar6 < (ulong)local_208._0_8_;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
LAB_001eeed2:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void save_load_memory_tree(memory_tree& b, io_buf& model_file, bool read, bool text)
    {
        stringstream msg;
        if (model_file.files.size() > 0){
            if (read)
                b.test_mode = true;

            if (read)
            {
                size_t ss = 0;
                writeit(ss, "stride_shift");
                b.all->weights.stride_shift(ss);
            }
            else
            {
                size_t ss = b.all->weights.stride_shift();
                writeit(ss, "stride_shift");
            }
            
            writeit(b.max_nodes, "max_nodes");
            writeit(b.learn_at_leaf, "learn_at_leaf");
            writeit(b.oas, "oas");
	        //writeit(b.leaf_example_multiplier, "leaf_example_multiplier")
            writeitvar(b.nodes.size(), "nodes", n_nodes); 
            writeit(b.max_num_labels, "max_number_of_labels");

            if (read){
                b.nodes.clear();
                for (uint32_t i = 0; i < n_nodes; i++)
                    b.nodes.push_back(node());
            }
            
            //node  
            for(uint32_t i = 0; i < n_nodes; i++){
                save_load_node(b.nodes[i], model_file, read, text, msg);
            }
            //deal with examples:
            writeitvar(b.examples.size(), "examples", n_examples);
            if (read){
                b.examples.clear();
                for (uint32_t i = 0; i < n_examples; i++){
                    example* new_ec = &calloc_or_throw<example>();
                    b.examples.push_back(new_ec);
                }
            }
            for (uint32_t i = 0; i < n_examples; i++)
                save_load_example(b.examples[i], model_file, read, text, msg, b.oas);
	    //cout<<"done loading...."<<endl;
            
            
        }
    }